

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_physical_buffer_store_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t alignment)

{
  undefined8 uVar1;
  uint uVar2;
  CallInst *pCVar3;
  bool bVar4;
  uint uVar5;
  Id IVar6;
  void *pvVar7;
  Value *pVVar8;
  Operation *pOVar9;
  Operation *this;
  uint8_t local_10c4;
  Operation *op;
  Id vec_id;
  Operation *store_op;
  Id local_1098;
  uint i;
  Id elems [4];
  Operation *chain_op;
  Operation *ptr_bitcast_op;
  Id u64_ptr_id;
  Id ptr_type_id;
  PhysicalPointerMeta tmp_ptr_meta;
  Id vec_type_id;
  Op value_cast_op;
  Id physical_type_id;
  Id array_id;
  Type *element_type;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint vecsize;
  uint32_t mask;
  Builder *builder;
  PhysicalPointerMeta *pPStack_28;
  uint32_t alignment_local;
  PhysicalPointerMeta *ptr_meta_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._4_4_ = alignment;
  pPStack_28 = ptr_meta;
  ptr_meta_local = (PhysicalPointerMeta *)instruction;
  instruction_local = (CallInst *)impl;
  _vecsize = Converter::Impl::builder(impl);
  cb._4_4_ = 0;
  bVar4 = get_constant_operand((Instruction *)ptr_meta_local,8,(uint32_t *)((long)&cb + 4));
  if (bVar4) {
    if ((builder._4_4_ != 0) ||
       (bVar4 = get_constant_operand
                          ((Instruction *)ptr_meta_local,9,(uint32_t *)((long)&builder + 4)), bVar4)
       ) {
      cb._0_4_ = 0;
      if (cb._4_4_ == 1) {
        cb._0_4_ = 1;
      }
      else if (cb._4_4_ == 3) {
        cb._0_4_ = 2;
      }
      else if (cb._4_4_ == 7) {
        cb._0_4_ = 3;
      }
      else {
        if (cb._4_4_ != 0xf) {
          buffer._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Unexpected mask for RawBufferStore = %u.\n",(ulong)cb._4_4_);
            fflush(_stderr);
          }
          else {
            snprintf((char *)&element_type,0x1000,"Unexpected mask for RawBufferStore = %u.\n",
                     (ulong)cb._4_4_);
            uVar1 = buffer._4088_8_;
            pvVar7 = get_thread_log_callback_userdata();
            (*(code *)uVar1)(pvVar7,2,&element_type);
          }
          return false;
        }
        cb._0_4_ = 4;
      }
      pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)ptr_meta_local,4);
      _physical_type_id = LLVMBC::Value::getType(pVVar8);
      value_cast_op =
           build_vectorized_physical_load_store_access
                     ((Impl *)instruction_local,(CallInst *)ptr_meta_local,(uint)cb,
                      _physical_type_id);
      get_physical_load_store_cast_info
                ((Impl *)instruction_local,_physical_type_id,&vec_type_id,&tmp_ptr_meta.size);
      tmp_ptr_meta._4_4_ = vec_type_id;
      if (1 < (uint)cb) {
        tmp_ptr_meta._4_4_ = spv::Builder::makeVectorType(_vecsize,vec_type_id,(uint)cb);
      }
      uVar2 = (uint)cb;
      u64_ptr_id._0_1_ = pPStack_28->nonwritable;
      u64_ptr_id._1_1_ = pPStack_28->nonreadable;
      u64_ptr_id._2_1_ = pPStack_28->coherent;
      u64_ptr_id._3_1_ = pPStack_28->rov;
      ptr_type_id._0_1_ = pPStack_28->stride;
      ptr_type_id._1_3_ = *(undefined3 *)&pPStack_28->field_0x5;
      tmp_ptr_meta._0_4_ = pPStack_28->size;
      if (value_cast_op == OpNop) {
        local_10c4 = '\0';
      }
      else {
        uVar5 = get_type_scalar_alignment((Impl *)instruction_local,_physical_type_id);
        local_10c4 = (char)uVar2 * (char)uVar5;
      }
      ptr_type_id._0_1_ = local_10c4;
      IVar6 = Converter::Impl::get_physical_pointer_block_type
                        ((Impl *)instruction_local,tmp_ptr_meta._4_4_,
                         (PhysicalPointerMeta *)&u64_ptr_id);
      pCVar3 = instruction_local;
      if (value_cast_op == OpNop) {
        ptr_bitcast_op._4_4_ =
             build_physical_pointer_address_for_raw_load_store
                       ((Impl *)instruction_local,(CallInst *)ptr_meta_local);
      }
      else {
        pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)ptr_meta_local,1);
        ptr_bitcast_op._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar3,pVVar8,0);
      }
      emit_buffer_synchronization_validation
                ((Impl *)instruction_local,(CallInst *)ptr_meta_local,Store);
      pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpBitcast,IVar6);
      Operation::add_id(pOVar9,ptr_bitcast_op._4_4_);
      Converter::Impl::add((Impl *)instruction_local,pOVar9,false);
      pCVar3 = instruction_local;
      IVar6 = spv::Builder::makePointer
                        (_vecsize,StorageClassPhysicalStorageBuffer,tmp_ptr_meta._4_4_);
      elems._8_8_ = Converter::Impl::allocate((Impl *)pCVar3,OpInBoundsAccessChain,IVar6);
      Operation::add_id((Operation *)elems._8_8_,pOVar9->id);
      uVar1 = elems._8_8_;
      IVar6 = spv::Builder::makeUintConstant(_vecsize,0,false);
      Operation::add_id((Operation *)uVar1,IVar6);
      if (value_cast_op != OpNop) {
        Operation::add_id((Operation *)elems._8_8_,value_cast_op);
      }
      Converter::Impl::add((Impl *)instruction_local,(Operation *)elems._8_8_,false);
      memset(&local_1098,0,0x10);
      for (store_op._4_4_ = 0; pCVar3 = instruction_local, store_op._4_4_ < 4;
          store_op._4_4_ = store_op._4_4_ + 1) {
        pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)ptr_meta_local,store_op._4_4_ + 4);
        Converter::Impl::register_externally_visible_write((Impl *)pCVar3,pVVar8);
        pCVar3 = instruction_local;
        pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)ptr_meta_local,store_op._4_4_ + 4);
        IVar6 = Converter::Impl::get_id_for_value((Impl *)pCVar3,pVVar8,0);
        (&local_1098)[store_op._4_4_] = IVar6;
      }
      pOVar9 = Converter::Impl::allocate((Impl *)instruction_local,OpStore);
      Operation::add_id(pOVar9,*(Id *)(elems._8_8_ + 4));
      op._4_4_ = Converter::Impl::build_vector
                           ((Impl *)instruction_local,vec_type_id,&local_1098,(uint)cb);
      if (tmp_ptr_meta.size != 0) {
        this = Converter::Impl::allocate
                         ((Impl *)instruction_local,tmp_ptr_meta.size,tmp_ptr_meta._4_4_);
        Operation::add_id(this,op._4_4_);
        Converter::Impl::add((Impl *)instruction_local,this,false);
        op._4_4_ = this->id;
      }
      Operation::add_id(pOVar9,op._4_4_);
      Operation::add_literal(pOVar9,2);
      Operation::add_literal(pOVar9,builder._4_4_);
      Converter::Impl::add((Impl *)instruction_local,pOVar9,(bool)(pPStack_28->rov & 1));
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

static bool emit_physical_buffer_store_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                   const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                   uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	uint32_t mask = 0;
	if (!get_constant_operand(instruction, 8, &mask))
		return false;

	if (alignment == 0 && !get_constant_operand(instruction, 9, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferStore = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getOperand(4)->getType();

	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	spv::Id vec_type_id = physical_type_id;
	if (vecsize > 1)
		vec_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(vec_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Store);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, vec_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	spv::Id elems[4] = {};
	for (unsigned i = 0; i < 4; i++)
	{
		impl.register_externally_visible_write(instruction->getOperand(4 + i));
		elems[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
	}

	auto *store_op = impl.allocate(spv::OpStore);
	store_op->add_id(chain_op->id);

	spv::Id vec_id = impl.build_vector(physical_type_id, elems, vecsize);
	if (value_cast_op != spv::OpNop)
	{
		auto *op = impl.allocate(value_cast_op, vec_type_id);
		op->add_id(vec_id);
		impl.add(op);
		vec_id = op->id;
	}

	store_op->add_id(vec_id);
	store_op->add_literal(spv::MemoryAccessAlignedMask);
	store_op->add_literal(alignment);

	impl.add(store_op, ptr_meta.rov);

	return true;
}